

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_array_benchmark.cc
# Opt level: O2

int main(int argc,char **argv)

{
  size_t i_5;
  TimeStamp TVar1;
  TimeStamp TVar2;
  unsigned_long uVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  size_t i_1;
  size_t i_2;
  pos_type pVar7;
  size_t i;
  pos_type pVar8;
  UnsignedBitmapArray<unsigned_long> array;
  
  if (1 < argc) {
    fprintf(_stderr,"%s does not take any arguments.\n",*argv);
  }
  bitmap::UnsignedBitmapArray<unsigned_long>::UnsignedBitmapArray(&array,0x6400000,'\x1e');
  TVar1 = GetTimestamp();
  for (pVar8 = 0; pVar8 != 0x6400000; pVar8 = pVar8 + 1) {
    bitmap::UnsignedBitmapArray<unsigned_long>::Set(&array,pVar8,pVar8);
  }
  TVar2 = GetTimestamp();
  lVar6 = 0;
  fprintf(_stderr,"Time to fill Unsigned Bitmap Array = %llu\n",TVar2 - TVar1);
  TVar1 = GetTimestamp();
  for (pVar8 = 0; pVar8 != 0x6400000; pVar8 = pVar8 + 1) {
    uVar3 = bitmap::UnsignedBitmapArray<unsigned_long>::Get(&array,pVar8);
    lVar6 = lVar6 + uVar3;
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to read Unsigned Bitmap Array = %llu; sum=%lld\n",TVar2 - TVar1,lVar6);
  bitmap::Bitmap::~Bitmap((Bitmap *)&array);
  bitmap::SignedBitmapArray<long>::SignedBitmapArray
            ((SignedBitmapArray<long> *)&array,0x6400000,'\x1e');
  TVar1 = GetTimestamp();
  for (pVar7 = 0; pVar7 != 0x6400000; pVar7 = pVar7 + 1) {
    bitmap::SignedBitmapArray<long>::Set((SignedBitmapArray<long> *)&array,pVar7,pVar7);
  }
  TVar2 = GetTimestamp();
  lVar6 = 0;
  fprintf(_stderr,"Time to fill Signed Bitmap Array = %llu\n",TVar2 - TVar1);
  TVar1 = GetTimestamp();
  for (pVar7 = 0; pVar7 != 0x6400000; pVar7 = pVar7 + 1) {
    lVar4 = bitmap::SignedBitmapArray<long>::Get((SignedBitmapArray<long> *)&array,pVar7);
    lVar6 = lVar6 + lVar4;
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to read Signed Bitmap Array = %llu; sum=%lld\n",TVar2 - TVar1,lVar6);
  bitmap::Bitmap::~Bitmap((Bitmap *)&array);
  pvVar5 = operator_new__(0x32000000);
  TVar1 = GetTimestamp();
  for (lVar6 = 0; lVar6 != 0x6400000; lVar6 = lVar6 + 1) {
    *(long *)((long)pvVar5 + lVar6 * 8) = lVar6;
  }
  TVar2 = GetTimestamp();
  lVar4 = 0;
  fprintf(_stderr,"Time to fill Array = %llu\n",TVar2 - TVar1);
  TVar1 = GetTimestamp();
  for (lVar6 = 0; lVar6 != 0x6400000; lVar6 = lVar6 + 1) {
    lVar4 = lVar4 + *(long *)((long)pvVar5 + lVar6 * 8);
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to read Array = %llu; sum=%lld\n",TVar2 - TVar1,lVar4);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  if (argc > 1) {
    fprintf(stderr, "%s does not take any arguments.\n", argv[0]);
  }

  TimeStamp t0, t1;

  {
    bitmap::UnsignedBitmapArray<uint64_t> array(ARRAY_SIZE, 30);

    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array.Set(i, i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Unsigned Bitmap Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      // assert(array[i] == i);
      sum += array.Get(i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to read Unsigned Bitmap Array = %llu; sum=%lld\n",
            (t1 - t0), sum);
  }
  {
    bitmap::SignedBitmapArray<int64_t> array(ARRAY_SIZE, 30);

    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array.Set(i, i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Signed Bitmap Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      // assert(array[i] == i);
      sum += array.Get(i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to read Signed Bitmap Array = %llu; sum=%lld\n",
            (t1 - t0), sum);
  }

  {
    int64_t *array = new int64_t[ARRAY_SIZE];
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array[i] = i;
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      sum += array[i];
    }
    t1 = GetTimestamp();
    fprintf(stderr, "Time to read Array = %llu; sum=%lld\n", (t1 - t0), sum);
  }
}